

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_io_primitive_writeOntoStderr
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t tuple;
  _Bool _Var1;
  size_t __size;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  tuple = *arguments;
  _Var1 = sysbvm_tuple_isBytes(tuple);
  if (!_Var1) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/io.c:136: assertion failure: sysbvm_tuple_isBytes(string)"
              );
  }
  if ((tuple & 0xf) == 0 && tuple != 0) {
    __size = (size_t)*(uint *)(tuple + 0xc);
  }
  else {
    __size = 0;
  }
  fwrite((void *)(tuple + 0x10),__size,1,_stdout);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_io_primitive_writeOntoStderr(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t string = arguments[0];
    SYSBVM_ASSERT(sysbvm_tuple_isBytes(string));
    fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, sysbvm_tuple_getSizeInBytes(string), 1, stdout);

    return SYSBVM_VOID_TUPLE;
}